

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall Body::Body(Body *this,Point *p,PObject n)

{
  Body *local_18;
  
  (this->super_Object).position.x = 0;
  (this->super_Object).position.y = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_move_00107cc0;
  (this->last).x = 0;
  (this->last).y = 0;
  (this->super_Object).ch = 'O';
  Point::operator=(&(this->super_Object).position,p);
  this->next = n;
  if (Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18 = this;
    std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*>
              ((vector<Object*,std::allocator<Object*>> *)&Object::obj,
               (iterator)
               Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Object **)&local_18);
  }
  else {
    *Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
     super__Vector_impl_data._M_finish = &this->super_Object;
    Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  (this->super_Object).on_map = true;
  return;
}

Assistant:

Body::Body(const Point& p, PObject n){
	ch = CHR_BODY;
	position = p;
	next = n;
	obj.push_back(this);
	on_map = true;
}